

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_str2addr(char *address,int port)

{
  int iVar1;
  undefined1 local_30 [8];
  in6_addr in6;
  in_addr in;
  int port_local;
  char *address_local;
  
  in6.__in6_u.__u6_addr32[3] = port;
  iVar1 = inet_pton(2,address,(void *)((long)&in6.__in6_u + 8));
  if (iVar1 < 1) {
    iVar1 = inet_pton(10,address,local_30);
    if (iVar1 < 1) {
      address_local = (char *)0x0;
    }
    else {
      address_local = (char *)Curl_ip2addr(10,local_30,address,in6.__in6_u.__u6_addr32[3]);
    }
  }
  else {
    address_local =
         (char *)Curl_ip2addr(2,(void *)((long)&in6.__in6_u + 8),address,in6.__in6_u.__u6_addr32[3])
    ;
  }
  return (Curl_addrinfo *)address_local;
}

Assistant:

struct Curl_addrinfo *Curl_str2addr(char *address, int port)
{
  struct in_addr in;
  if(Curl_inet_pton(AF_INET, address, &in) > 0)
    /* This is a dotted IP address 123.123.123.123-style */
    return Curl_ip2addr(AF_INET, &in, address, port);
#ifdef ENABLE_IPV6
  {
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, address, &in6) > 0)
      /* This is a dotted IPv6 address ::1-style */
      return Curl_ip2addr(AF_INET6, &in6, address, port);
  }
#endif
  return NULL; /* bad input format */
}